

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::passModelName(Highs *this,string *name)

{
  int iVar1;
  string *in_RSI;
  long in_RDI;
  HighsStatus local_4;
  
  iVar1 = std::__cxx11::string::length();
  if (iVar1 < 1) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,"Cannot define empty model names\n");
    local_4 = kError;
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x238),in_RSI);
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::passModelName(const std::string& name) {
  if (int(name.length()) <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Cannot define empty model names\n");
    return HighsStatus::kError;
  }
  this->model_.lp_.model_name_ = name;
  return HighsStatus::kOk;
}